

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_ConstAcc.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_ConstAcc::ChFunction_ConstAcc
          (ChFunction_ConstAcc *this,double m_h,double m_av,double m_aw,double m_end)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar4 [64];
  undefined8 in_XMM2_Qb;
  undefined1 in_register_000012c8 [56];
  undefined1 auVar5 [64];
  
  auVar5._8_56_ = in_register_000012c8;
  auVar5._0_8_ = m_end;
  auVar4._8_56_ = in_register_00001248;
  auVar4._0_8_ = m_av;
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_00b6c480;
  this->h = m_h;
  auVar3 = ZEXT816(0);
  auVar1 = vmaxsd_avx(auVar3,auVar5._0_16_);
  this->end = auVar1._0_8_;
  auVar1 = vmaxsd_avx(auVar3,auVar4._0_16_);
  auVar2 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar1);
  this->av = auVar2._0_8_;
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = m_aw;
  auVar1 = vmaxsd_avx(auVar3,auVar1);
  auVar1 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar1);
  auVar1 = vmaxsd_avx(auVar2,auVar1);
  this->aw = auVar1._0_8_;
  return;
}

Assistant:

ChFunction_ConstAcc::ChFunction_ConstAcc(double m_h, double m_av, double m_aw, double m_end) : h(m_h) {
    Set_end(m_end);
    Set_avw(m_av, m_aw);
}